

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O3

void __thiscall Solution::mutate_insertion(Solution *this)

{
  Vehicle *this_00;
  Vehicle *this_01;
  Point *p;
  int iVar1;
  int iVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  _List_node_base *p_Var5;
  int ec;
  int local_34;
  Solution *local_30;
  
  p_Var5 = (this->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  iVar1 = rand();
  uVar4 = (ulong)(long)iVar1 %
          (this->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
          _M_size;
  if ((long)uVar4 < 1) {
    for (; uVar4 != 0; uVar4 = uVar4 + 1) {
      p_Var5 = p_Var5->_M_prev;
    }
  }
  else {
    do {
      p_Var5 = p_Var5->_M_next;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  this_00 = (Vehicle *)p_Var5[1]._M_next;
  if ((this_00->nodes).
      super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
      ._M_impl._M_node._M_size != 1) {
    p_Var5 = (this->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    iVar1 = rand();
    uVar4 = (ulong)(long)iVar1 %
            (this->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node
            ._M_size;
    if ((long)uVar4 < 1) {
      for (; uVar4 != 0; uVar4 = uVar4 + 1) {
        p_Var5 = p_Var5->_M_prev;
      }
    }
    else {
      do {
        p_Var5 = p_Var5->_M_next;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    this_01 = (Vehicle *)p_Var5[1]._M_next;
    p_Var5 = (this_00->nodes).
             super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    iVar1 = rand();
    uVar4 = (ulong)(long)iVar1 %
            (this_00->nodes).
            super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
            ._M_impl._M_node._M_size;
    if ((long)uVar4 < 1) {
      for (; uVar4 != 0; uVar4 = uVar4 + 1) {
        p_Var5 = p_Var5->_M_prev;
      }
    }
    else {
      do {
        p_Var5 = p_Var5->_M_next;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    p = (Point *)(p_Var5[1]._M_next)->_M_next;
    local_30 = this;
    pmVar3 = std::__detail::
             _Map_base<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&p->state,&local_30);
    iVar1 = pmVar3->second;
    Vehicle::remove_node(this_00,iVar1);
    local_34 = 0;
    iVar2 = rand();
    Vehicle::add_node(this_01,p,
                      (int)((ulong)(long)iVar2 %
                           (this_01->nodes).
                           super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
                           ._M_impl._M_node._M_size),&local_34);
    if (local_34 != 0) {
      local_34 = 0;
      Vehicle::add_node(this_00,p,iVar1,&local_34);
    }
  }
  return;
}

Assistant:

void Solution::mutate_insertion() {
    auto vit = vehicles.begin();
    Vehicle *v1;
    Vehicle *v2;
    std::advance(vit, rand() % vehicles.size());
    v1 = *vit;

    if (v1->nodes.size() == 1)
        return;

    vit = vehicles.begin();
    std::advance(vit, rand() % vehicles.size());
    v2 = *vit;

    auto nid = v1->nodes.begin();
    std::advance(nid, rand() % v1->nodes.size());
    auto node = (*nid)->p;
    auto original_position = node->state[this].second;

    v1->remove_node(original_position);
    //tries to insert at a random position
    auto ec = 0;
    v2->add_node(node, rand() % v2->nodes.size(), ec);
    if (ec != 0)//Error
    {
        ec = 0;
        v1->add_node(node, original_position, ec);
    }
}